

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O2

void __thiscall Kgc::sweep(Kgc *this)

{
  Value *v;
  Value **ppVVar1;
  
  ppVVar1 = &this->firstObject_;
  while (v = *ppVVar1, v != (Value *)0x0) {
    if (v->marked_ == 0) {
      *ppVVar1 = v->next_;
      dealloc(this,v);
    }
    else {
      v->marked_ = 0;
      ppVVar1 = &v->next_;
    }
  }
  return;
}

Assistant:

void Kgc::sweep()
{
    const Value **object = &firstObject_;
    while (*object)
    {
        if (!(*object)->marked_)
        {
            const Value *unreached = *object;
            *object = unreached->next_;
            dealloc(unreached);
        } else
        {
            (*object)->marked_ = 0;
            object = (const Value **)&(*object)->next_;
        }
    }
}